

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystemFrontend.cpp
# Opt level: O2

void __thiscall
llbuild::buildsystem::BuildSystemInvocation::parse
          (BuildSystemInvocation *this,
          ArrayRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          args,SourceMgr *sourceMgr)

{
  short *psVar1;
  ArrayRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> AVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  long lVar5;
  SchedulerAlgorithm SVar6;
  char *__lhs;
  string *psVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg;
  bool bVar8;
  ArrayRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_110;
  anon_class_16_2_f26e8178 error;
  char *end_1;
  string *local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> algorithm;
  char *end;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  Twine local_48;
  
  local_110.Length = args.Length;
  local_d0 = (string *)&this->dbPath;
  AVar2 = args;
  error.sourceMgr = sourceMgr;
  error.this = this;
  do {
    local_110 = AVar2;
    bVar8 = local_110.Length == 0;
    if (bVar8) {
      return;
    }
    pbVar3 = llvm::
             ArrayRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::front(&local_110);
    local_110 = llvm::
                ArrayRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::slice(&local_110,1);
    bVar8 = std::operator==(pbVar3,"-");
    if (bVar8) {
      pbVar3 = local_110.Data;
      for (lVar5 = local_110.Length << 5; lVar5 != 0; lVar5 = lVar5 + -0x20) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&this->positionalArgs,pbVar3);
        pbVar3 = pbVar3 + 1;
      }
      return;
    }
    if ((pbVar3->_M_string_length == 0) || (*(pbVar3->_M_dataplus)._M_p == '-')) {
      bVar8 = std::operator==(pbVar3,"--help");
      if (bVar8) {
        this->showUsage = true;
        return;
      }
      bVar8 = std::operator==(pbVar3,"--version");
      if (bVar8) {
        this->showVersion = true;
        return;
      }
      bVar8 = std::operator==(pbVar3,"--no-db");
      if (bVar8) {
        std::__cxx11::string::assign((char *)local_d0);
      }
      else {
        bVar8 = std::operator==(pbVar3,"--db");
        if (bVar8) {
          if (local_110.Length == 0) {
LAB_00189bcf:
            __lhs = "missing argument to \'";
LAB_00189bd6:
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &end_1,__lhs,pbVar3);
            std::operator+(&algorithm,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &end_1,"\'");
            llvm::Twine::Twine((Twine *)&local_c8,&algorithm);
            parse::anon_class_16_2_f26e8178::operator()(&error,(Twine *)&local_c8);
LAB_00189c1a:
            std::__cxx11::string::_M_dispose();
            std::__cxx11::string::_M_dispose();
            return;
          }
          llvm::
          ArrayRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator[](&local_110,0);
          psVar7 = local_d0;
LAB_0018989b:
          std::__cxx11::string::_M_assign(psVar7);
        }
        else {
          bVar8 = std::operator==(pbVar3,"-C");
          if ((bVar8) || (bVar8 = std::operator==(pbVar3,"--chdir"), bVar8)) {
            if (local_110.Length == 0) goto LAB_00189bcf;
            llvm::
            ArrayRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator[](&local_110,0);
            psVar7 = (string *)&this->chdirPath;
            goto LAB_0018989b;
          }
          bVar8 = std::operator==(pbVar3,"-f");
          if (bVar8) {
            if (local_110.Length == 0) goto LAB_00189bcf;
            llvm::
            ArrayRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator[](&local_110,0);
            psVar7 = (string *)&this->buildFilePath;
            goto LAB_0018989b;
          }
          bVar8 = std::operator==(pbVar3,"--serial");
          if (bVar8) {
            this->useSerialBuild = true;
            goto LAB_001898b8;
          }
          bVar8 = std::operator==(pbVar3,"--scheduler");
          if (bVar8) {
            if (local_110.Length == 0) goto LAB_00189bcf;
            pbVar3 = llvm::
                     ArrayRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator[](&local_110,0);
            std::__cxx11::string::string((string *)&algorithm,(string *)pbVar3);
            bVar8 = std::operator==(&algorithm,"commandNamePriority");
            if (bVar8) {
              SVar6 = NamePriority;
            }
            else {
              bVar8 = std::operator==(&algorithm,"default");
              SVar6 = NamePriority;
              if (!bVar8) {
                bVar8 = std::operator==(&algorithm,"fifo");
                SVar6 = FIFO;
                if (!bVar8) {
                  std::operator+(&local_c8,"unknown scheduler algorithm \'",&algorithm);
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&end_1,&local_c8,"\'");
                  llvm::Twine::Twine((Twine *)&local_68,
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&end_1);
                  parse::anon_class_16_2_f26e8178::operator()(&error,(Twine *)&local_68);
                  std::__cxx11::string::_M_dispose();
                  goto LAB_00189c1a;
                }
              }
            }
            this->schedulerAlgorithm = SVar6;
            local_110 = llvm::
                        ArrayRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::slice(&local_110,1);
            std::__cxx11::string::_M_dispose();
            goto LAB_001898b8;
          }
          bVar8 = std::operator==(pbVar3,"-j");
          if ((!bVar8) && (bVar8 = std::operator==(pbVar3,"--jobs"), !bVar8)) {
            if ((pbVar3->_M_string_length < 2) ||
               (psVar1 = (short *)(pbVar3->_M_dataplus)._M_p, *psVar1 != 0x6a2d)) {
              bVar8 = std::operator==(pbVar3,"-v");
              if ((!bVar8) && (bVar8 = std::operator==(pbVar3,"--verbose"), !bVar8)) {
                bVar8 = std::operator==(pbVar3,"--trace");
                if (bVar8) {
                  if (local_110.Length != 0) {
                    llvm::
                    ArrayRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator[](&local_110,0);
                    psVar7 = (string *)&this->traceFilePath;
                    goto LAB_0018989b;
                  }
                  goto LAB_00189bcf;
                }
                __lhs = "invalid option \'";
                goto LAB_00189bd6;
              }
              this->showVerboseStatus = true;
            }
            else {
              lVar5 = strtol((char *)(psVar1 + 1),&end_1,10);
              this->schedulerLanes = (uint32_t)lVar5;
              if (*end_1 != '\0') {
                llvm::Twine::Twine((Twine *)&algorithm,"invalid argument to \'-j\'");
                parse::anon_class_16_2_f26e8178::operator()(&error,(Twine *)&algorithm);
              }
            }
            goto LAB_001898b8;
          }
          if (local_110.Length == 0) goto LAB_00189bcf;
          pbVar4 = llvm::
                   ArrayRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator[](&local_110,0);
          lVar5 = strtol((pbVar4->_M_dataplus)._M_p,&end,10);
          this->schedulerLanes = (uint32_t)lVar5;
          if (*end != '\0') {
            pbVar4 = llvm::
                     ArrayRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator[](&local_110,0);
            std::operator+(&local_68,"invalid argument \'",pbVar4);
            std::operator+(&local_c8,&local_68,"\' to \'");
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &end_1,&local_c8,pbVar3);
            std::operator+(&algorithm,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &end_1,"\'");
            llvm::Twine::Twine(&local_48,&algorithm);
            parse::anon_class_16_2_f26e8178::operator()(&error,&local_48);
            std::__cxx11::string::_M_dispose();
            std::__cxx11::string::_M_dispose();
            std::__cxx11::string::_M_dispose();
            std::__cxx11::string::_M_dispose();
          }
        }
        local_110 = llvm::
                    ArrayRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::slice(&local_110,1);
      }
    }
    else {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->positionalArgs,pbVar3);
    }
LAB_001898b8:
    AVar2 = local_110;
  } while( true );
}

Assistant:

void BuildSystemInvocation::parse(llvm::ArrayRef<std::string> args,
                                  llvm::SourceMgr& sourceMgr) {
  auto error = [&](const Twine &message) {
    sourceMgr.PrintMessage(llvm::SMLoc{}, llvm::SourceMgr::DK_Error, message);
    hadErrors = true;
  };

  while (!args.empty()) {
    const auto& option = args.front();
    args = args.slice(1);

    if (option == "-") {
      for (const auto& arg: args) {
        positionalArgs.push_back(arg);
      }
      break;
    }

    if (!option.empty() && option[0] != '-') {
      positionalArgs.push_back(option);
      continue;
    }
    
    if (option == "--help") {
      showUsage = true;
      break;
    } else if (option == "--version") {
      showVersion = true;
      break;
    } else if (option == "--no-db") {
      dbPath = "";
    } else if (option == "--db") {
      if (args.empty()) {
        error("missing argument to '" + option + "'");
        break;
      }
      dbPath = args[0];
      args = args.slice(1);
    } else if (option == "-C" || option == "--chdir") {
      if (args.empty()) {
        error("missing argument to '" + option + "'");
        break;
      }
      chdirPath = args[0];
      args = args.slice(1);
    } else if (option == "-f") {
      if (args.empty()) {
        error("missing argument to '" + option + "'");
        break;
      }
      buildFilePath = args[0];
      args = args.slice(1);
    } else if (option == "--serial") {
      useSerialBuild = true;
    } else if (option == "--scheduler") {
      if (args.empty()) {
        error("missing argument to '" + option + "'");
        break;
      }
      auto algorithm = args[0];
      if (algorithm == "commandNamePriority" || algorithm == "default") {
        schedulerAlgorithm = SchedulerAlgorithm::NamePriority;
      } else if (algorithm == "fifo") {
        schedulerAlgorithm = SchedulerAlgorithm::FIFO;
      } else {
        error("unknown scheduler algorithm '" + algorithm + "'");
        break;
      }
      args = args.slice(1);
    } else if (option == "-j" || option == "--jobs") {
      if (args.empty()) {
        error("missing argument to '" + option + "'");
        break;
      }
      char *end;
      schedulerLanes = ::strtol(args[0].c_str(), &end, 10);
      if (*end != '\0') {
        error("invalid argument '" + args[0] + "' to '" + option + "'");
      }
      args = args.slice(1);
    } else if (StringRef(option).startswith("-j")) {
      char *end;
      schedulerLanes = ::strtol(&option[2], &end, 10);
      if (*end != '\0') {
        error("invalid argument to '-j'");
      }
    } else if (option == "-v" || option == "--verbose") {
      showVerboseStatus = true;
    } else if (option == "--trace") {
      if (args.empty()) {
        error("missing argument to '" + option + "'");
        break;
      }
      traceFilePath = args[0];
      args = args.slice(1);
    } else {
      error("invalid option '" + option + "'");
      break;
    }
  }
}